

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Apu::write_ggstereo(Sms_Apu *this,blip_time_t time,int data)

{
  uint uVar1;
  int in_EDX;
  long in_RDI;
  Blip_Buffer *old_output;
  int flags;
  Sms_Osc *osc;
  int i;
  Blip_Synth<12,_1> *this_00;
  blip_time_t in_stack_ffffffffffffffdc;
  Sms_Apu *in_stack_ffffffffffffffe0;
  long lVar2;
  undefined4 local_14;
  
  run_until(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    lVar2 = *(long *)(in_RDI + (long)local_14 * 8);
    uVar1 = in_EDX >> ((byte)local_14 & 0x1f);
    this_00 = *(Blip_Synth<12,_1> **)(lVar2 + 0x20);
    *(uint *)(lVar2 + 0x28) = (int)uVar1 >> 3 & 2U | uVar1 & 1;
    *(undefined8 *)(lVar2 + 0x20) = *(undefined8 *)(lVar2 + (long)*(int *)(lVar2 + 0x28) * 8);
    if ((*(Blip_Synth<12,_1> **)(lVar2 + 0x20) != this_00) && (*(int *)(lVar2 + 0x30) != 0)) {
      if (this_00 != (Blip_Synth<12,_1> *)0x0) {
        Blip_Buffer::set_modified((Blip_Buffer *)this_00);
        Blip_Synth<12,_1>::offset
                  (this_00,(blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x81952a)
        ;
      }
      *(undefined4 *)(lVar2 + 0x30) = 0;
    }
  }
  return;
}

Assistant:

void Sms_Apu::write_ggstereo( blip_time_t time, int data )
{
	require( (unsigned) data <= 0xFF );
	
	run_until( time );
	
	for ( int i = 0; i < osc_count; i++ )
	{
		Sms_Osc& osc = *oscs [i];
		int flags = data >> i;
		Blip_Buffer* old_output = osc.output;
		osc.output_select = (flags >> 3 & 2) | (flags & 1);
		osc.output = osc.outputs [osc.output_select];
		if ( osc.output != old_output && osc.last_amp )
		{
			if ( old_output )
			{
				old_output->set_modified();
				square_synth.offset( time, -osc.last_amp, old_output );
			}
			osc.last_amp = 0;
		}
	}
}